

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-ignore.c
# Opt level: O1

char * get_autoinscription(object_kind *kind,_Bool aware)

{
  char *pcVar1;
  
  if (kind != (object_kind *)0x0) {
    pcVar1 = quark_str((&kind->note_aware)[!aware]);
    return pcVar1;
  }
  return (char *)0x0;
}

Assistant:

const char *get_autoinscription(struct object_kind *kind, bool aware)
{
	if (!kind)
		return NULL;
	else if (aware)
		return quark_str(kind->note_aware);
	else 
		return quark_str(kind->note_unaware);
}